

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

bytecode_t * tchecker::compile(typed_expression_t *expr)

{
  undefined1 auVar1 [16];
  expression_type_t eVar2;
  invalid_argument *this;
  size_type sVar3;
  runtime_error *prVar4;
  reference pvVar5;
  ulong uVar6;
  bytecode_t *__dest;
  long *__src;
  invalid_argument *e;
  runtime_error *e_1;
  bytecode_t *b;
  vector<long,_std::allocator<long>_> *local_58;
  undefined1 local_50 [8];
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  compiler;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> back_inserter;
  vector<long,_std::allocator<long>_> bytecode;
  typed_expression_t *expr_local;
  
  eVar2 = typed_expression_t::type(expr);
  if (eVar2 == EXPR_TYPE_BAD) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid expression");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&back_inserter);
  local_58 = (vector<long,_std::allocator<long>_> *)
             std::back_inserter<std::vector<long,std::allocator<long>>>
                       ((vector<long,_std::allocator<long>_> *)&back_inserter);
  compiler._bytecode_back_inserter =
       (back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_58;
  details::
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50,(back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_58);
  (**(code **)(*(long *)expr + 0x30))(expr,local_50);
  b = (bytecode_t *)0x0;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&compiler._bytecode_back_inserter,(value_type_conflict3 *)&b);
  sVar3 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)&back_inserter);
  if (sVar3 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"compilation produced no bytecode");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar5 = std::vector<long,_std::allocator<long>_>::back
                     ((vector<long,_std::allocator<long>_> *)&back_inserter);
  if (*pvVar5 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"bytecode is not null-terminated");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)&back_inserter);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __dest = (bytecode_t *)operator_new__(uVar6);
  __src = std::vector<long,_std::allocator<long>_>::data
                    ((vector<long,_std::allocator<long>_> *)&back_inserter);
  sVar3 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)&back_inserter);
  memcpy(__dest,__src,sVar3 << 3);
  details::
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&back_inserter);
  return __dest;
}

Assistant:

tchecker::bytecode_t * compile(tchecker::typed_expression_t const & expr)
{
  try {
    if (expr.type() == tchecker::EXPR_TYPE_BAD)
      throw std::invalid_argument("invalid expression");

    // Compilation
    std::vector<tchecker::bytecode_t> bytecode;
    auto back_inserter = std::back_inserter(bytecode);

    tchecker::details::rvalue_expression_compiler_t<decltype(back_inserter)> compiler(back_inserter);
    expr.visit(compiler);
    back_inserter = tchecker::VM_RET;

    // Production
    if (bytecode.size() == 0)
      throw std::runtime_error("compilation produced no bytecode");
    if (bytecode.back() != tchecker::VM_RET)
      throw std::runtime_error("bytecode is not null-terminated");

    tchecker::bytecode_t * b = new tchecker::bytecode_t[bytecode.size()];
    std::memcpy(b, bytecode.data(), bytecode.size() * sizeof(tchecker::bytecode_t));

    return b;
  }
  catch (std::invalid_argument const & e) {
    throw std::invalid_argument("compiling expression " + expr.to_string() + ", " + e.what());
  }
  catch (std::runtime_error const & e) {
    throw std::runtime_error("compiling expression " + expr.to_string() + ", " + e.what());
  }
}